

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

void helicsQuerySetQueryString(HelicsQuery query,char *queryString,HelicsError *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  QueryObject *pQVar2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pQVar2 = anon_unknown.dwarf_182b7::getQueryObj(query,err);
  if (pQVar2 != (QueryObject *)0x0) {
    paVar1 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar1;
    if (queryString == (char *)0x0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_38,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                 gHelicsEmptyStr_abi_cxx11_._M_string_length);
    }
    else {
      sVar3 = strlen(queryString);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,queryString,queryString + sVar3);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&pQVar2->query,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void helicsQuerySetQueryString(HelicsQuery query, const char* queryString, HelicsError* err)
{
    auto* queryObj = getQueryObj(query, err);
    if (queryObj == nullptr) {
        return;
    }
    queryObj->query = AS_STRING(queryString);
}